

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::treeCompare(DOMTest *this,DOMNode *node,DOMNode *node2)

{
  int iVar1;
  long lVar2;
  DOMNode *node_00;
  DOMNode *node2_00;
  wchar16 *pwVar3;
  wchar16 *pwVar4;
  bool bVar5;
  DOMNode *local_40;
  DOMNode *kid2;
  DOMNode *kid;
  bool answer;
  DOMNode *node2_local;
  DOMNode *node_local;
  DOMTest *this_local;
  
  kid._7_1_ = true;
  kid2 = (DOMNode *)(**(code **)(*(long *)node + 0x38))();
  local_40 = (DOMNode *)(**(code **)(*(long *)node2 + 0x38))();
  if ((kid2 == (DOMNode *)0x0) || (local_40 == (DOMNode *)0x0)) {
    if (kid2 != local_40) {
      return false;
    }
  }
  else {
    kid._7_1_ = treeCompare(this,kid2,local_40);
    if (!kid._7_1_) {
      return kid._7_1_;
    }
    lVar2 = (**(code **)(*(long *)kid2 + 0x50))();
    if ((lVar2 == 0) || (lVar2 = (**(code **)(*(long *)local_40 + 0x50))(), lVar2 == 0)) {
      lVar2 = (**(code **)(*(long *)kid2 + 0x50))();
      if ((lVar2 != 0) || (lVar2 = (**(code **)(*(long *)local_40 + 0x50))(), lVar2 != 0)) {
        return false;
      }
    }
    else {
      while( true ) {
        lVar2 = (**(code **)(*(long *)kid2 + 0x50))();
        bVar5 = false;
        if (lVar2 != 0) {
          lVar2 = (**(code **)(*(long *)local_40 + 0x50))();
          bVar5 = lVar2 != 0;
        }
        if (!bVar5) break;
        node_00 = (DOMNode *)(**(code **)(*(long *)kid2 + 0x50))();
        node2_00 = (DOMNode *)(**(code **)(*(long *)local_40 + 0x50))();
        kid._7_1_ = treeCompare(this,node_00,node2_00);
        if (!kid._7_1_) {
          return kid._7_1_;
        }
        kid2 = (DOMNode *)(**(code **)(*(long *)kid2 + 0x50))();
        local_40 = (DOMNode *)(**(code **)(*(long *)local_40 + 0x50))();
      }
    }
  }
  pwVar3 = (wchar16 *)(**(code **)(*(long *)node + 0x10))();
  pwVar4 = (wchar16 *)(**(code **)(*(long *)node2 + 0x10))();
  iVar1 = xercesc_4_0::XMLString::compareString(pwVar3,pwVar4);
  if (iVar1 == 0) {
    lVar2 = (**(code **)(*(long *)node + 0x18))();
    if ((lVar2 == 0) && (lVar2 = (**(code **)(*(long *)node2 + 0x18))(), lVar2 != 0)) {
      this_local._7_1_ = false;
    }
    else {
      lVar2 = (**(code **)(*(long *)node + 0x18))();
      if ((lVar2 == 0) || (lVar2 = (**(code **)(*(long *)node2 + 0x18))(), lVar2 != 0)) {
        pwVar3 = (wchar16 *)(**(code **)(*(long *)node + 0x18))();
        pwVar4 = (wchar16 *)(**(code **)(*(long *)node2 + 0x18))();
        iVar1 = xercesc_4_0::XMLString::compareString(pwVar3,pwVar4);
        if (iVar1 == 0) {
          this_local._7_1_ = kid._7_1_;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DOMTest::treeCompare(DOMNode* node, DOMNode* node2)
{
    bool answer = true;

    DOMNode*  kid, *kid2;         // Check the subtree for equality
    kid = node->getFirstChild();
    kid2 = node2->getFirstChild();
    if (kid && kid2)
    {
        answer = treeCompare(kid, kid2);
        if (!answer)
            return answer;
        else
            if (kid->getNextSibling() && kid2->getNextSibling())
            {
                while (kid->getNextSibling() && kid2->getNextSibling())
                {
                    answer = treeCompare(kid->getNextSibling(), kid2->getNextSibling());
                    if (!answer)
                        return answer;
                    else
                    {
                        kid = kid->getNextSibling();
                        kid2 = kid2->getNextSibling();
                    }
                }
            } else
                if (!(!kid->getNextSibling() && !kid2->getNextSibling()))
                {
                    return false;
                }
    } else
        if (kid != kid2)
        {
            // One or the other of (kid1, kid2) is 0, but not both.
            return false;
        }

    if (XMLString::compareString(node->getNodeName(), node2->getNodeName()))
        return false;
    if (node->getNodeValue()==0 && node2->getNodeValue()!=0)
        return false;
    if (node->getNodeValue()!=0 && node2->getNodeValue()==0)
        return false;
    if (XMLString::compareString(node->getNodeValue(), node2->getNodeValue()))
        return false;

    return answer;
}